

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O2

int sys_loadlib_iter(char *path,_loadlib_data *data)

{
  char *name;
  int iVar1;
  t_symbol *ptVar2;
  _class *p_Var3;
  undefined8 *puVar4;
  loader_queue_t *plVar5;
  char *local_800;
  char dirbuf [1000];
  char classslashclass [1000];
  
  for (plVar5 = &loaders; plVar5 != (loader_queue_t *)0x0; plVar5 = plVar5->next) {
    iVar1 = (*plVar5->loader)(data->canvas,data->classname,path);
    if (iVar1 != 0) goto LAB_0016d41d;
  }
  if (path == (char *)0x0) {
LAB_0016d41b:
    iVar1 = 0;
  }
  else {
    name = data->classname;
    snprintf(classslashclass,1000,"%s/%s",name,name);
    iVar1 = sys_trytoopenone(path,name,".pd",dirbuf,&local_800,1000,1);
    if (iVar1 < 0) {
      iVar1 = sys_trytoopenone(path,name,".pat",dirbuf,&local_800,1000,1);
      if (iVar1 < 0) {
        iVar1 = sys_trytoopenone(path,classslashclass,".pd",dirbuf,&local_800,1000,1);
        if (iVar1 < 0) goto LAB_0016d41b;
      }
    }
    close(iVar1);
    ptVar2 = gensym(dirbuf);
    class_set_extern_dir(ptVar2);
    ptVar2 = gensym(name);
    p_Var3 = class_new(ptVar2,do_create_abstraction,(t_method)0x0,0,0,A_GIMME,0);
    if (p_Var3 != (_class *)0x0) {
      puVar4 = (undefined8 *)getbytes(0x10);
      *puVar4 = p_Var3;
      puVar4[1] = sys_do_load_abs_abstraction_classes;
      sys_do_load_abs_abstraction_classes = puVar4;
    }
    class_set_extern_dir(&s_);
    iVar1 = 1;
  }
LAB_0016d41d:
  data->ok = iVar1;
  return (int)(iVar1 == 0);
}

Assistant:

int sys_loadlib_iter(const char *path, struct _loadlib_data *data)
{
    int ok = 0;
    loader_queue_t *q;
    for(q = &loaders; q; q = q->next)
        if ((ok = q->loader(data->canvas, data->classname, path)))
            break;
    /* if all loaders failed, try to load as abstraction */
    if (!ok)
        ok = sys_do_load_abs(data->canvas, data->classname, path);
    data->ok = ok;
    return (ok == 0);
}